

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

BCRec * __thiscall
amrex::StateData::getBC(BCRec *__return_storage_ptr__,StateData *this,int comp,int i)

{
  BCRec *pBVar1;
  long lVar2;
  undefined4 uVar3;
  Box local_34;
  
  __return_storage_ptr__->bc[4] = -0x29a;
  __return_storage_ptr__->bc[5] = -0x29a;
  __return_storage_ptr__->bc[0] = -0x29a;
  __return_storage_ptr__->bc[1] = -0x29a;
  __return_storage_ptr__->bc[2] = -0x29a;
  __return_storage_ptr__->bc[3] = -0x29a;
  BATransformer::operator()
            (&local_34,&(this->grids).m_bat,
             (Box *)((long)i * 0x1c +
                    *(long *)&(((this->grids).m_ref.
                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data));
  pBVar1 = StateDescriptor::getBC(this->desc,comp);
  lVar2 = 0;
  do {
    uVar3 = 0;
    if (*(int *)((long)local_34.smallend.vect + lVar2) <=
        *(int *)((long)(this->domain).smallend.vect + lVar2)) {
      uVar3 = *(undefined4 *)((long)pBVar1->bc + lVar2);
    }
    *(undefined4 *)((long)__return_storage_ptr__->bc + lVar2) = uVar3;
    uVar3 = 0;
    if (*(int *)((long)(this->domain).bigend.vect + lVar2) <=
        *(int *)((long)local_34.bigend.vect + lVar2)) {
      uVar3 = *(undefined4 *)((long)pBVar1->bc + lVar2 + 0xc);
    }
    *(undefined4 *)((long)__return_storage_ptr__->bc + lVar2 + 0xc) = uVar3;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  return __return_storage_ptr__;
}

Assistant:

BCRec
StateData::getBC (int comp, int i) const noexcept
{
    BCRec bcr;
    amrex::setBC(grids[i],domain,desc->getBC(comp),bcr);
    return bcr;
}